

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char cVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  char *pcVar5;
  pointer pbVar6;
  size_type sVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  long lVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  long *plVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  string value;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  value_type local_100;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0;
  ulong local_b8;
  long local_b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long *local_80;
  char *local_78;
  long local_70;
  long lStack_68;
  undefined1 *local_60;
  uint local_54;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_e0[0] = local_d0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"\'\"`","");
  local_c0 = (long *)(str->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = (pointer)((long)local_c0 + str->_M_string_length);
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_60);
  str->_M_string_length = (long)local_60 - (long)(str->_M_dataplus)._M_p;
  *local_60 = 0;
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar4 = (str->_M_dataplus)._M_p;
  if (pcVar4 + str->_M_string_length == _Var8._M_current) {
    str->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (str->_M_string_length != 0) {
    local_54 = (uint)(byte)delimiter;
    do {
      lVar9 = ::std::__cxx11::string::find
                        ((char)local_e0,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
      pcVar5 = (str->_M_dataplus)._M_p;
      if (lVar9 == -1) {
        _Var8 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar5,pcVar5 + str->_M_string_length,local_54);
        pcVar4 = (str->_M_dataplus)._M_p;
        if (_Var8._M_current == pcVar4 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x145047);
        }
        else {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_100,pcVar4,_Var8._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_100);
          local_c0 = local_b0;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_c0,_Var8._M_current + 1,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_c0);
          if (local_c0 != local_b0) {
            operator_delete(local_c0,local_b0[0] + 1);
          }
          uVar14 = local_100.field_2._M_allocated_capacity;
          _Var15._M_p = local_100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
LAB_0012d745:
            operator_delete(_Var15._M_p,uVar14 + 1);
          }
        }
      }
      else {
        cVar1 = *pcVar5;
        lVar9 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
        if (lVar9 == -1) {
LAB_0012d3f6:
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x145047);
          if (lVar9 != -1) {
LAB_0012d4e2:
            pbVar6 = (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_a0 = &local_90;
            pcVar4 = pbVar6[-1]._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar4,pcVar4 + pbVar6[-1]._M_string_length);
            local_c0 = local_b0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"\\","");
            plVar11 = (long *)::std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_c0,local_b8,0,'\x01');
            local_80 = &local_70;
            plVar13 = plVar11 + 2;
            if ((long *)*plVar11 == plVar13) {
              local_70 = *plVar13;
              lStack_68 = plVar11[3];
            }
            else {
              local_70 = *plVar13;
              local_80 = (long *)*plVar11;
            }
            local_78 = (char *)plVar11[1];
            *plVar11 = (long)plVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_50 = local_40;
            ::std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
            uVar12 = ::std::__cxx11::string::find((char *)&local_a0,(ulong)local_80,0);
            sVar7 = local_98;
            while (uVar12 != 0xffffffffffffffff) {
              local_98 = sVar7;
              ::std::__cxx11::string::replace((ulong)&local_a0,uVar12,local_78,(ulong)local_50);
              uVar12 = ::std::__cxx11::string::find
                                 ((char *)&local_a0,(ulong)local_80,uVar12 + local_48);
              sVar7 = local_98;
            }
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            if (local_a0 != &local_90) {
              local_100._M_dataplus._M_p = (pointer)local_a0;
            }
            local_100.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
            local_100.field_2._M_local_buf[0] = local_90._M_local_buf[0];
            local_98 = 0;
            local_90._M_local_buf[0] = '\0';
            local_100._M_string_length = sVar7;
            local_a0 = &local_90;
            ::std::__cxx11::string::operator=
                      ((string *)
                       ((__return_storage_ptr__->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            if (local_80 != &local_70) {
              operator_delete(local_80,local_70 + 1);
            }
            if (local_c0 != local_b0) {
              operator_delete(local_c0,local_b0[0] + 1);
            }
            if (local_a0 != &local_90) {
              uVar14 = CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
              _Var15._M_p = (pointer)local_a0;
              goto LAB_0012d745;
            }
          }
        }
        else {
          cVar2 = (str->_M_dataplus)._M_p[lVar9 + -1];
          cVar3 = cVar2;
          while (cVar3 == '\\') {
            lVar10 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)cVar1);
            if (lVar10 == -1) goto LAB_0012d3f6;
            cVar3 = (str->_M_dataplus)._M_p[lVar10 + -1];
          }
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if (cVar2 == '\\') goto LAB_0012d4e2;
        }
      }
      local_c0 = (long *)(str->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)((long)local_c0 + str->_M_string_length);
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_60,&local_100,&local_c0);
      str->_M_string_length = (long)local_60 - (long)(str->_M_dataplus)._M_p;
      *local_60 = 0;
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar4 = (str->_M_dataplus)._M_p;
      if (pcVar4 + str->_M_string_length == _Var8._M_current) {
        str->_M_string_length = 0;
        *pcVar4 = '\0';
      }
      else {
        ::std::__cxx11::string::_M_erase((ulong)str,0);
      }
    } while (str->_M_string_length != 0);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) {  // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}